

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

Vec2 __thiscall
tcu::anon_unknown_3::getLineCoordAtAxisCoord
          (anon_unknown_3 *this,Vec2 *pa,Vec2 *pb,bool isXAxis,float axisCoord)

{
  Vec2 VVar1;
  undefined3 in_register_00000009;
  ulong uVar2;
  float fVar3;
  float in_XMM0_Db;
  float fVar4;
  
  uVar2 = (ulong)(uint)(CONCAT31(in_register_00000009,isXAxis) * 4);
  fVar4 = *(float *)((long)pa->m_data + uVar2);
  fVar4 = (axisCoord - pa->m_data[!isXAxis]) *
          ((*(float *)((long)pb->m_data + uVar2) - fVar4) /
          (pb->m_data[!isXAxis] - pa->m_data[!isXAxis])) + fVar4;
  fVar3 = fVar4;
  if (CONCAT31(in_register_00000009,isXAxis) == 0) {
    fVar3 = axisCoord;
    axisCoord = fVar4;
  }
  *(float *)this = axisCoord;
  *(float *)(this + 4) = fVar3;
  VVar1.m_data[1] = in_XMM0_Db;
  VVar1.m_data[0] = fVar3;
  return (Vec2)VVar1.m_data;
}

Assistant:

tcu::Vec2 getLineCoordAtAxisCoord (const tcu::Vec2& pa, const tcu::Vec2& pb, bool isXAxis, float axisCoord)
{
	const int	fixedCoordNdx		= (isXAxis) ? (0) : (1);
	const int	varyingCoordNdx		= (isXAxis) ? (1) : (0);

	const float	fixedDifference		= pb[fixedCoordNdx] - pa[fixedCoordNdx];
	const float	varyingDifference	= pb[varyingCoordNdx] - pa[varyingCoordNdx];

	DE_ASSERT(fixedDifference != 0.0f);

	const float	resultFixedCoord	= axisCoord;
	const float	resultVaryingCoord	= pa[varyingCoordNdx] + (axisCoord - pa[fixedCoordNdx]) * (varyingDifference / fixedDifference);

	return (isXAxis) ? (tcu::Vec2(resultFixedCoord, resultVaryingCoord))
					 : (tcu::Vec2(resultVaryingCoord, resultFixedCoord));
}